

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

void Dar_BalancePermute(Aig_Man_t *p,Vec_Ptr_t *vSuper,int LeftBound,int fExor)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  bool bVar5;
  ulong uVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  uint uVar12;
  
  uVar12 = vSuper->nSize;
  uVar9 = uVar12 - 2;
  if ((int)uVar9 < LeftBound) {
    __assert_fail("LeftBound <= RightBound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                  ,0x118,"void Dar_BalancePermute(Aig_Man_t *, Vec_Ptr_t *, int, int)");
  }
  if (uVar9 != LeftBound) {
    if (((int)uVar12 < 1) || ((ulong)uVar12 == 1)) {
LAB_004f1b81:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pAVar2 = (Aig_Obj_t *)vSuper->pArray[(ulong)uVar12 - 1];
    pAVar11 = (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe);
    if (p->pConst1 != pAVar11) {
      pAVar3 = (Aig_Obj_t *)vSuper->pArray[uVar9];
      if ((pAVar11 != (Aig_Obj_t *)((ulong)pAVar3 & 0xfffffffffffffffe)) &&
         (p->pConst1 != (Aig_Obj_t *)((ulong)pAVar3 & 0xfffffffffffffffe))) {
        uVar6 = 6 - (ulong)(fExor == 0);
        uVar12 = uVar9;
        do {
          if (((int)uVar12 < 0) || (iVar1 = vSuper->nSize, iVar1 <= (int)uVar12)) goto LAB_004f1b81;
          pAVar4 = (Aig_Obj_t *)vSuper->pArray[uVar12];
          pAVar7 = (Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe);
          if (p->pConst1 == pAVar7) {
LAB_004f1b27:
            vSuper->pArray[uVar12] = pAVar3;
joined_r0x004f1b34:
            if ((int)uVar9 < iVar1) {
              vSuper->pArray[uVar9] = pAVar4;
              return;
            }
LAB_004f1c1c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          if (pAVar11 == pAVar7) {
            if (pAVar4 == pAVar3) {
              return;
            }
            goto LAB_004f1b27;
          }
          if ((fExor == 0) && ((*(uint *)&pAVar11->field_0x18 & 7) == 1)) {
            __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x15d,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
          if (pAVar4 == (Aig_Obj_t *)0x0) {
            if (pAVar11 == (Aig_Obj_t *)0x0) {
              __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x15f,
                            "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                           );
            }
            *(ulong *)&(p->Ghost).field_0x18 =
                 *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | uVar6;
            pAVar8 = pAVar2;
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            if ((*(uint *)&pAVar7->field_0x18 & 7) == 1) {
              __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x15e,
                            "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                           );
            }
            *(ulong *)&(p->Ghost).field_0x18 =
                 *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | uVar6;
            pAVar8 = pAVar4;
            pAVar10 = pAVar2;
            if (pAVar11->Id < pAVar7->Id) {
              pAVar8 = pAVar2;
              pAVar10 = pAVar4;
            }
          }
          (p->Ghost).pFanin0 = pAVar8;
          (p->Ghost).pFanin1 = pAVar10;
          pAVar7 = Aig_TableLookup(p,&p->Ghost);
          if (pAVar7 != (Aig_Obj_t *)0x0) {
            if (pAVar4 == pAVar3) {
              return;
            }
            iVar1 = vSuper->nSize;
            if (iVar1 <= (int)uVar12) goto LAB_004f1c1c;
            vSuper->pArray[uVar12] = pAVar3;
            goto joined_r0x004f1b34;
          }
          bVar5 = LeftBound < (int)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar5);
      }
    }
  }
  return;
}

Assistant:

void Dar_BalancePermute( Aig_Man_t * p, Vec_Ptr_t * vSuper, int LeftBound, int fExor )
{
    Aig_Obj_t * pObj1, * pObj2, * pObj3, * pGhost;
    int RightBound, i;
    // get the right bound
    RightBound = Vec_PtrSize(vSuper) - 2;
    assert( LeftBound <= RightBound );
    if ( LeftBound == RightBound )
        return;
    // get the two last nodes
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, RightBound + 1 );
    pObj2 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, RightBound     );
    if ( Aig_Regular(pObj1) == p->pConst1 || Aig_Regular(pObj2) == p->pConst1 || Aig_Regular(pObj1) == Aig_Regular(pObj2) )
        return;
    // find the first node that can be shared
    for ( i = RightBound; i >= LeftBound; i-- )
    {
        pObj3 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, i );
        if ( Aig_Regular(pObj3) == p->pConst1 )
        {
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
        if ( Aig_Regular(pObj1) == Aig_Regular(pObj3) )
        {
            if ( pObj3 == pObj2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
        pGhost = Aig_ObjCreateGhost( p, pObj1, pObj3, fExor? AIG_OBJ_EXOR : AIG_OBJ_AND );
        if ( Aig_TableLookup( p, pGhost ) )
        {
            if ( pObj3 == pObj2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
    }
/*
    // we did not find the node to share, randomize choice
    {
        int Choice = Aig_ManRandom(0) % (RightBound - LeftBound + 1);
        pObj3 = Vec_PtrEntry( vSuper, LeftBound + Choice );
        if ( pObj3 == pObj2 )
            return;
        Vec_PtrWriteEntry( vSuper, LeftBound + Choice, pObj2 );
        Vec_PtrWriteEntry( vSuper, RightBound,         pObj3 );
    }
*/
}